

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sn76489.c
# Opt level: O0

void sn76496_w_maxim(SN76489_Context *chip,UINT8 reg,UINT8 data)

{
  UINT8 data_local;
  UINT8 reg_local;
  SN76489_Context *chip_local;
  
  if (reg == '\0') {
    SN76489_Write(chip,data);
  }
  else if (reg == '\x01') {
    SN76489_GGStereoWrite(chip,data);
  }
  return;
}

Assistant:

static void sn76496_w_maxim(SN76489_Context* chip, UINT8 reg, UINT8 data)
{
	switch(reg)
	{
	case SN76496_W_REG:
		SN76489_Write(chip, data);
		break;
	case SN76496_W_GGST:
		SN76489_GGStereoWrite(chip, data);
		break;
	}
	return;
}